

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

void __thiscall
CBlockPolicyEstimator::processTransaction(CBlockPolicyEstimator *this,NewMempoolTransactionInfo *tx)

{
  long lVar1;
  ConstevalFormatString<1U> fmt;
  string_view source_file;
  string_view logging_function;
  undefined1 uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  pointer val;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Level unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  uint bucketIndex3;
  uint bucketIndex2;
  uint bucketIndex;
  bool validForFeeEstimation;
  Txid *hash;
  uint txHeight;
  CFeeRate feeRate;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  transaction_identifier<false> *in_stack_fffffffffffffe60;
  map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
  *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_fffffffffffffe98;
  LogFlags in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  size_t in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  byte bVar7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_fffffffffffffe98,
             (AnnotatedMixin<std::mutex> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88
             ,(char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe7c,SUB41((uint)in_stack_fffffffffffffe78 >> 0x18,0));
  uVar4 = *(uint *)(in_RSI + 0x20);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  CTransaction::GetHash
            ((CTransaction *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  pcVar5 = (char *)std::
                   map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
                   ::count(in_stack_fffffffffffffe68,&in_stack_fffffffffffffe60->m_wrapped);
  if (pcVar5 == (char *)0x0) {
    if (uVar4 == *(uint *)(in_RDI + 0x58)) {
      bVar7 = 0;
      if ((((*(byte *)(in_RSI + 0x28) & 1) == 0) && (bVar7 = 0, (*(byte *)(in_RSI + 0x29) & 1) == 0)
          ) && (bVar7 = 0, (*(byte *)(in_RSI + 0x2a) & 1) != 0)) {
        bVar7 = *(byte *)(in_RSI + 0x2b);
      }
      if ((bVar7 & 1) == 0) {
        *(int *)(in_RDI + 0xb4) = *(int *)(in_RDI + 0xb4) + 1;
      }
      else {
        *(int *)(in_RDI + 0xb0) = *(int *)(in_RDI + 0xb0) + 1;
        CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                           ,(CAmount *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                           ,(uint32_t)((ulong)in_stack_fffffffffffffe68 >> 0x20));
        transaction_identifier::operator_cast_to_uint256_
                  ((transaction_identifier<false> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        pmVar6 = std::
                 map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
                 ::operator[]((map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        pmVar6->blockHeight = uVar4;
        std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                  ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        CFeeRate::GetFeePerK
                  ((CFeeRate *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        uVar3 = TxConfirmStats::NewTx
                          ((TxConfirmStats *)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                           in_stack_fffffffffffffe74,(double)in_stack_fffffffffffffe88);
        uVar4 = uVar3;
        transaction_identifier::operator_cast_to_uint256_
                  ((transaction_identifier<false> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        pmVar6 = std::
                 map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
                 ::operator[]((map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        pmVar6->bucketIndex = uVar4;
        std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                  ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        CFeeRate::GetFeePerK
                  ((CFeeRate *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        uVar4 = TxConfirmStats::NewTx
                          ((TxConfirmStats *)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                           in_stack_fffffffffffffe74,(double)in_stack_fffffffffffffe88);
        if (uVar3 != uVar4) {
          __assert_fail("bucketIndex == bucketIndex2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                        ,0x278,
                        "void CBlockPolicyEstimator::processTransaction(const NewMempoolTransactionInfo &)"
                       );
        }
        val = std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
                        ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
                         CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        CFeeRate::GetFeePerK
                  ((CFeeRate *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        uVar4 = TxConfirmStats::NewTx
                          ((TxConfirmStats *)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                           in_stack_fffffffffffffe74,(double)val);
        if (uVar3 != uVar4) {
          __assert_fail("bucketIndex == bucketIndex3",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                        ,0x27a,
                        "void CBlockPolicyEstimator::processTransaction(const NewMempoolTransactionInfo &)"
                       );
        }
      }
    }
  }
  else {
    uVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),Trace)
    ;
    if ((bool)uVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      transaction_identifier<false>::ToString_abi_cxx11_(in_stack_fffffffffffffe60);
      in_stack_fffffffffffffe58 = 1;
      logging_function._M_len._6_1_ = in_stack_ffffffffffffff26;
      logging_function._M_len._0_6_ = in_stack_ffffffffffffff20;
      logging_function._M_len._7_1_ = uVar2;
      logging_function._M_str = pcVar5;
      source_file._M_str = in_stack_ffffffffffffff18;
      source_file._M_len = in_stack_ffffffffffffff10;
      fmt.fmt._4_4_ = in_stack_ffffffffffffff0c;
      fmt.fmt._0_4_ = in_stack_ffffffffffffff08;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                 unaff_retaddr,fmt,in_stack_00000010);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CBlockPolicyEstimator::processTransaction(const NewMempoolTransactionInfo& tx)
{
    LOCK(m_cs_fee_estimator);
    const unsigned int txHeight = tx.info.txHeight;
    const auto& hash = tx.info.m_tx->GetHash();
    if (mapMemPoolTxs.count(hash)) {
        LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error mempool tx %s already being tracked\n",
                 hash.ToString());
        return;
    }

    if (txHeight != nBestSeenHeight) {
        // Ignore side chains and re-orgs; assuming they are random they don't
        // affect the estimate.  We'll potentially double count transactions in 1-block reorgs.
        // Ignore txs if BlockPolicyEstimator is not in sync with ActiveChain().Tip().
        // It will be synced next time a block is processed.
        return;
    }
    // This transaction should only count for fee estimation if:
    // - it's not being re-added during a reorg which bypasses typical mempool fee limits
    // - the node is not behind
    // - the transaction is not dependent on any other transactions in the mempool
    // - it's not part of a package.
    const bool validForFeeEstimation = !tx.m_mempool_limit_bypassed && !tx.m_submitted_in_package && tx.m_chainstate_is_current && tx.m_has_no_mempool_parents;

    // Only want to be updating estimates when our blockchain is synced,
    // otherwise we'll miscalculate how many blocks its taking to get included.
    if (!validForFeeEstimation) {
        untrackedTxs++;
        return;
    }
    trackedTxs++;

    // Feerates are stored and reported as BTC-per-kb:
    const CFeeRate feeRate(tx.info.m_fee, tx.info.m_virtual_transaction_size);

    mapMemPoolTxs[hash].blockHeight = txHeight;
    unsigned int bucketIndex = feeStats->NewTx(txHeight, static_cast<double>(feeRate.GetFeePerK()));
    mapMemPoolTxs[hash].bucketIndex = bucketIndex;
    unsigned int bucketIndex2 = shortStats->NewTx(txHeight, static_cast<double>(feeRate.GetFeePerK()));
    assert(bucketIndex == bucketIndex2);
    unsigned int bucketIndex3 = longStats->NewTx(txHeight, static_cast<double>(feeRate.GetFeePerK()));
    assert(bucketIndex == bucketIndex3);
}